

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voprf.cc
# Opt level: O3

int hash_to_scalar_challenge
              (VOPRF_METHOD *method,EC_SCALAR *out,EC_AFFINE *Bm,EC_AFFINE *a0,EC_AFFINE *a1,
              EC_AFFINE *a2,EC_AFFINE *a3)

{
  int iVar1;
  EC_GROUP *group;
  uint uVar2;
  size_t len;
  CBB cbb;
  uint8_t transcript [346];
  size_t local_1d0;
  CBB local_1c8;
  uint8_t local_198 [360];
  uint uVar3;
  
  group = (*voprf_pst1_method.group_func)();
  iVar1 = CBB_init_fixed(&local_1c8,local_198,0x15a);
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 != 0) {
    iVar1 = cbb_serialize_point(&local_1c8,group,(EC_AFFINE *)out);
    if (iVar1 != 0) {
      iVar1 = cbb_serialize_point(&local_1c8,group,Bm);
      if (iVar1 != 0) {
        iVar1 = cbb_serialize_point(&local_1c8,group,a0);
        uVar2 = uVar3;
        if (iVar1 != 0) {
          iVar1 = cbb_serialize_point(&local_1c8,group,a1);
          if (iVar1 != 0) {
            iVar1 = cbb_serialize_point(&local_1c8,group,a2);
            if (iVar1 != 0) {
              iVar1 = CBB_add_bytes(&local_1c8,"Challenge",9);
              if (iVar1 != 0) {
                uVar2 = 0;
                iVar1 = CBB_finish(&local_1c8,(uint8_t **)0x0,&local_1d0);
                if (iVar1 != 0) {
                  iVar1 = (*voprf_pst1_method.hash_to_scalar)
                                    (group,(EC_SCALAR *)method,local_198,local_1d0);
                  uVar2 = (uint)(iVar1 != 0);
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int hash_to_scalar_challenge(const VOPRF_METHOD *method, EC_SCALAR *out,
                                    const EC_AFFINE *Bm, const EC_AFFINE *a0,
                                    const EC_AFFINE *a1, const EC_AFFINE *a2,
                                    const EC_AFFINE *a3) {
  static const uint8_t kChallengeLabel[] = "Challenge";

  const EC_GROUP *group = method->group_func();
  CBB cbb;
  uint8_t transcript[5 * EC_MAX_COMPRESSED + 2 + sizeof(kChallengeLabel) - 1];
  size_t len;
  if (!CBB_init_fixed(&cbb, transcript, sizeof(transcript)) ||
      !cbb_serialize_point(&cbb, group, Bm) ||
      !cbb_serialize_point(&cbb, group, a0) ||
      !cbb_serialize_point(&cbb, group, a1) ||
      !cbb_serialize_point(&cbb, group, a2) ||
      !cbb_serialize_point(&cbb, group, a3) ||
      !CBB_add_bytes(&cbb, kChallengeLabel, sizeof(kChallengeLabel) - 1) ||
      !CBB_finish(&cbb, NULL, &len) ||
      !method->hash_to_scalar(group, out, transcript, len)) {
    return 0;
  }

  return 1;
}